

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O3

void __thiscall CConsole::AddCommandSorted(CConsole *this,CCommand *pCommand)

{
  CCommand *pCVar1;
  int iVar2;
  CCommand **ppCVar3;
  CCommand *pCVar4;
  
  ppCVar3 = &this->m_pFirstCommand;
  if (this->m_pFirstCommand != (CCommand *)0x0) {
    iVar2 = str_comp((pCommand->super_CCommandInfo).m_pName,
                     (this->m_pFirstCommand->super_CCommandInfo).m_pName);
    if (0 < iVar2) {
      pCVar4 = (CCommand *)0x0;
      do {
        pCVar1 = *ppCVar3;
        if (pCVar1 == (CCommand *)0x0) {
          return;
        }
        ppCVar3 = &pCVar1->m_pNext;
        if (pCVar1->m_pNext == (CCommand *)0x0) goto LAB_001bd24b;
        iVar2 = str_comp((pCommand->super_CCommandInfo).m_pName,
                         (pCVar1->m_pNext->super_CCommandInfo).m_pName);
      } while (0 < iVar2);
      pCVar4 = *ppCVar3;
      goto LAB_001bd24b;
    }
    pCVar4 = *ppCVar3;
    if ((pCVar4 != (CCommand *)0x0) && (pCVar4->m_pNext != (CCommand *)0x0)) goto LAB_001bd24b;
  }
  pCVar4 = (CCommand *)0x0;
LAB_001bd24b:
  pCommand->m_pNext = pCVar4;
  *ppCVar3 = pCommand;
  return;
}

Assistant:

void CConsole::AddCommandSorted(CCommand *pCommand)
{
	if(!m_pFirstCommand || str_comp(pCommand->m_pName, m_pFirstCommand->m_pName) <= 0)
	{
		if(m_pFirstCommand && m_pFirstCommand->m_pNext)
			pCommand->m_pNext = m_pFirstCommand;
		else
			pCommand->m_pNext = 0;
		m_pFirstCommand = pCommand;
	}
	else
	{
		for(CCommand *p = m_pFirstCommand; p; p = p->m_pNext)
		{
			if(!p->m_pNext || str_comp(pCommand->m_pName, p->m_pNext->m_pName) <= 0)
			{
				pCommand->m_pNext = p->m_pNext;
				p->m_pNext = pCommand;
				break;
			}
		}
	}
}